

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_coder.c
# Opt level: O0

lzma_ret copy_or_code(lzma_simple_coder *coder,lzma_allocator *allocator,uint8_t *in,size_t *in_pos,
                     size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,lzma_action action)

{
  lzma_ret lVar1;
  lzma_ret ret;
  uint8_t *out_local;
  size_t in_size_local;
  size_t *in_pos_local;
  uint8_t *in_local;
  lzma_allocator *allocator_local;
  lzma_simple_coder *coder_local;
  
  if ((coder->end_was_reached & 1U) != 0) {
    __assert_fail("!coder->end_was_reached",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/simple/simple_coder.c"
                  ,0x1a,
                  "lzma_ret copy_or_code(lzma_simple_coder *, const lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                 );
  }
  if ((coder->next).code == (lzma_code_function)0x0) {
    lzma_bufcpy(in,in_pos,in_size,out,out_pos,out_size);
    if ((((coder->is_encoder & 1U) != 0) && (action == LZMA_FINISH)) && (*in_pos == in_size)) {
      coder->end_was_reached = true;
    }
  }
  else {
    lVar1 = (*(coder->next).code)
                      ((coder->next).coder,allocator,in,in_pos,in_size,out,out_pos,out_size,action);
    if (lVar1 == LZMA_STREAM_END) {
      if (((coder->is_encoder & 1U) != 0) && (action != LZMA_FINISH)) {
        __assert_fail("!coder->is_encoder || action == LZMA_FINISH",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/simple/simple_coder.c"
                      ,0x2d,
                      "lzma_ret copy_or_code(lzma_simple_coder *, const lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                     );
      }
      coder->end_was_reached = true;
    }
    else if (lVar1 != LZMA_OK) {
      return lVar1;
    }
  }
  return LZMA_OK;
}

Assistant:

static lzma_ret
copy_or_code(lzma_simple_coder *coder, const lzma_allocator *allocator,
		const uint8_t *restrict in, size_t *restrict in_pos,
		size_t in_size, uint8_t *restrict out,
		size_t *restrict out_pos, size_t out_size, lzma_action action)
{
	assert(!coder->end_was_reached);

	if (coder->next.code == NULL) {
		lzma_bufcpy(in, in_pos, in_size, out, out_pos, out_size);

		// Check if end of stream was reached.
		if (coder->is_encoder && action == LZMA_FINISH
				&& *in_pos == in_size)
			coder->end_was_reached = true;

	} else {
		// Call the next coder in the chain to provide us some data.
		const lzma_ret ret = coder->next.code(
				coder->next.coder, allocator,
				in, in_pos, in_size,
				out, out_pos, out_size, action);

		if (ret == LZMA_STREAM_END) {
			assert(!coder->is_encoder
					|| action == LZMA_FINISH);
			coder->end_was_reached = true;

		} else if (ret != LZMA_OK) {
			return ret;
		}
	}

	return LZMA_OK;
}